

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

void Assimp::IFC::FindLikelyCrossingLines(iterator current)

{
  ulong *puVar1;
  pointer paVar2;
  pointer paVar3;
  _Bit_type *p_Var4;
  pointer paVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  paVar2 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar3 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar2 == paVar3) {
    dVar9 = 0.0;
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    lVar8 = 0;
    dVar11 = 0.0;
    do {
      dVar9 = *(double *)((long)&paVar2->x + lVar8);
      if (lVar8 != 0) {
        dVar11 = ABS(dVar9 - dVar11);
        dVar12 = ABS(*(double *)((long)&paVar2->y + lVar8) - dVar10);
        dVar10 = dVar12;
        if (dVar12 <= dVar11) {
          dVar10 = dVar11;
        }
        if (ABS(dVar11 - dVar12) < dVar10 * 0.8) {
          uVar7 = (lVar8 >> 4) - 1;
          uVar6 = (lVar8 >> 4) + 0x3e;
          if (-1 < (long)uVar7) {
            uVar6 = uVar7;
          }
          puVar1 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   ((long)uVar6 >> 6) +
                   (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
          *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
          dVar9 = *(double *)((long)&paVar2->x + lVar8);
        }
      }
      paVar5 = (pointer)((long)&paVar2[1].x + lVar8);
      dVar10 = *(double *)((long)&paVar2->y + lVar8);
      lVar8 = lVar8 + 0x10;
      dVar11 = dVar9;
    } while (paVar5 != paVar3);
  }
  dVar11 = ABS(paVar2->x - dVar9);
  dVar10 = ABS(paVar2->y - dVar10);
  dVar9 = dVar10;
  if (dVar10 <= dVar11) {
    dVar9 = dVar11;
  }
  if (ABS(dVar11 - dVar10) < dVar9 * 0.8) {
    p_Var4 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = (ulong)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    lVar8 = (long)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)p_Var4;
    uVar6 = (uVar7 + lVar8 * 8) - 1;
    uVar7 = uVar7 + lVar8 * 8 + 0x3e;
    if (-1 < (long)uVar6) {
      uVar7 = uVar6;
    }
    puVar1 = p_Var4 + ((long)uVar7 >> 6) +
                      (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff;
    *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
  }
  return;
}

Assistant:

void FindLikelyCrossingLines(ContourVector::iterator current)
{
    SkipList& skiplist = (*current).skiplist;
    IfcVector2 last_proj_point;

    const Contour::const_iterator cbegin = (*current).contour.begin(), cend = (*current).contour.end();
    for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {
        const IfcVector2& proj_point = *cit;

        if (cit != cbegin) {
            IfcVector2 vdelta = proj_point - last_proj_point;
            if (LikelyDiagonal(vdelta)) {
                skiplist[std::distance(cbegin, cit) - 1] = true;
            }
        }

        last_proj_point = proj_point;
    }

    // handle last segment
    if (LikelyDiagonal(*cbegin - last_proj_point)) {
        skiplist[skiplist.size()-1] = true;
    }
}